

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_26::TapAssertionPrinter::printReconstructedExpression(TapAssertionPrinter *this)

{
  ostream *poVar1;
  bool bVar2;
  char local_32 [2];
  string expr;
  
  bVar2 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar2) {
    poVar1 = this->stream;
    expr._M_dataplus._M_p = (pointer)this->colourImpl;
    expr._M_string_length._0_4_ = 0x17;
    expr._M_string_length._4_1_ = 1;
    (*((ColourImpl *)expr._M_dataplus._M_p)->_vptr_ColourImpl[2])(expr._M_dataplus._M_p,0x17);
    std::operator<<(poVar1," for: ");
    ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)&expr);
    AssertionResult::getExpandedExpression_abi_cxx11_(&expr,this->result);
    local_32[1] = 10;
    local_32[0] = ' ';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )expr._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(expr._M_dataplus._M_p +
                 CONCAT44(expr._M_string_length._4_4_,(undefined4)expr._M_string_length)),
               local_32 + 1,local_32);
    std::operator<<(this->stream,(string *)&expr);
    std::__cxx11::string::~string((string *)&expr);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if (result.hasExpandedExpression()) {
                    stream << colourImpl->guardColour( tapDimColour ) << " for: ";

                    std::string expr = result.getExpandedExpression();
                    std::replace(expr.begin(), expr.end(), '\n', ' ');
                    stream << expr;
                }
            }